

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O1

int __thiscall
chaiscript::detail::Any::Data_Impl<std::shared_ptr<char>_>::clone
          (Data_Impl<std::shared_ptr<char>_> *this,__fn *__fn,void *__child_stack,int __flags,
          void *__arg,...)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  
  pp_Var3 = (_func_int **)operator_new(0x20);
  p_Var1 = *(_func_int **)(__fn + 0x10);
  p_Var2 = *(_func_int **)(__fn + 0x18);
  if (p_Var2 != (_func_int *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(p_Var2 + 8) = *(int *)(p_Var2 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(p_Var2 + 8) = *(int *)(p_Var2 + 8) + 1;
    }
  }
  pp_Var3[1] = (_func_int *)&std::shared_ptr<char>::typeinfo;
  *pp_Var3 = (_func_int *)&PTR__Data_Impl_005a5170;
  pp_Var3[2] = p_Var1;
  pp_Var3[3] = p_Var2;
  (this->super_Data)._vptr_Data = pp_Var3;
  return (int)this;
}

Assistant:

std::unique_ptr<Data> clone() const override { return std::make_unique<Data_Impl<T>>(m_data); }